

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NewFrame(void)

{
  float *pfVar1;
  ImVec2 IVar2;
  bool bVar3;
  ImGuiKeyModFlags IVar4;
  ImGuiWindow *pIVar5;
  ImGuiWindow **ppIVar6;
  float fVar7;
  ImGuiWindow *window;
  int i_1;
  float memory_compact_start_time;
  int i;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_00000324;
  bool *in_stack_00000328;
  char *in_stack_00000330;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  float new_size;
  float in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  float local_48;
  uint3 in_stack_ffffffffffffffbc;
  float max_error;
  ImVec2 in_stack_ffffffffffffffc0;
  ImGuiWindow *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar8;
  float in_stack_ffffffffffffffdc;
  undefined1 restore_focus_to_window_under_popup;
  float in_stack_ffffffffffffffe0;
  int iVar9;
  ImVec4 local_18;
  ImGuiContext *local_8;
  
  max_error = (float)(uint)in_stack_ffffffffffffffbc;
  if (GImGui != (ImGuiContext *)0x0) {
    max_error = (float)CONCAT13(1,in_stack_ffffffffffffffbc);
  }
  if ((char)((uint)max_error >> 0x18) == '\0') {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0xe9b,"void ImGui::NewFrame()");
  }
  local_8 = GImGui;
  ErrorCheckNewFrameSanityChecks();
  UpdateSettings();
  local_8->Time = (double)(local_8->IO).DeltaTime + local_8->Time;
  local_8->WithinFrameScope = true;
  local_8->FrameCount = local_8->FrameCount + 1;
  local_8->TooltipOverrideCount = 0;
  local_8->WindowsActiveCount = 0;
  ImVector<unsigned_int>::resize
            ((ImVector<unsigned_int> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
             ,in_stack_ffffffffffffffac);
  local_8->FramerateSecPerFrameAccum =
       ((local_8->IO).DeltaTime - local_8->FramerateSecPerFrame[local_8->FramerateSecPerFrameIdx]) +
       local_8->FramerateSecPerFrameAccum;
  local_8->FramerateSecPerFrame[local_8->FramerateSecPerFrameIdx] = (local_8->IO).DeltaTime;
  local_8->FramerateSecPerFrameIdx = (local_8->FramerateSecPerFrameIdx + 1) % 0x78;
  if (local_8->FramerateSecPerFrameAccum <= 0.0) {
    local_48 = 3.4028235e+38;
  }
  else {
    local_48 = 1.0 / (local_8->FramerateSecPerFrameAccum / 120.0);
  }
  (local_8->IO).Framerate = local_48;
  ((local_8->IO).Fonts)->Locked = true;
  GetDefaultFont();
  SetCurrentFont((ImFont *)in_stack_ffffffffffffffc0);
  bVar3 = ImFont::IsLoaded(local_8->Font);
  if (!bVar3) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0xeb8,"void ImGui::NewFrame()");
  }
  ImVec4::ImVec4(&local_18,0.0,0.0,(local_8->IO).DisplaySize.x,(local_8->IO).DisplaySize.y);
  (local_8->DrawListSharedData).ClipRectFullscreen.x = local_18.x;
  (local_8->DrawListSharedData).ClipRectFullscreen.y = local_18.y;
  (local_8->DrawListSharedData).ClipRectFullscreen.z = local_18.z;
  (local_8->DrawListSharedData).ClipRectFullscreen.w = local_18.w;
  (local_8->DrawListSharedData).CurveTessellationTol = (local_8->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleSegmentMaxError
            ((ImDrawListSharedData *)in_stack_ffffffffffffffc0,max_error);
  (local_8->DrawListSharedData).InitialFlags = 0;
  if (((local_8->Style).AntiAliasedLines & 1U) != 0) {
    (local_8->DrawListSharedData).InitialFlags = (local_8->DrawListSharedData).InitialFlags | 1;
  }
  if (((local_8->Style).AntiAliasedFill & 1U) != 0) {
    (local_8->DrawListSharedData).InitialFlags = (local_8->DrawListSharedData).InitialFlags | 2;
  }
  if (((local_8->IO).BackendFlags & 8U) != 0) {
    (local_8->DrawListSharedData).InitialFlags = (local_8->DrawListSharedData).InitialFlags | 4;
  }
  ImDrawList::Clear((ImDrawList *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  ImDrawList::PushTextureID
            ((ImDrawList *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (ImTextureID)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  ImDrawList::PushClipRectFullScreen((ImDrawList *)in_stack_ffffffffffffffc0);
  ImDrawList::Clear((ImDrawList *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  ImDrawList::PushTextureID
            ((ImDrawList *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (ImTextureID)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  ImDrawList::PushClipRectFullScreen((ImDrawList *)in_stack_ffffffffffffffc0);
  ImDrawData::Clear((ImDrawData *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (((local_8->DragDropActive & 1U) != 0) &&
     ((local_8->DragDropPayload).SourceId == local_8->ActiveId)) {
    KeepAliveID((local_8->DragDropPayload).SourceId);
  }
  if (local_8->HoveredIdPreviousFrame == 0) {
    local_8->HoveredIdTimer = 0.0;
  }
  if ((local_8->HoveredIdPreviousFrame == 0) ||
     ((local_8->HoveredId != 0 && (local_8->ActiveId == local_8->HoveredId)))) {
    local_8->HoveredIdNotActiveTimer = 0.0;
  }
  if (local_8->HoveredId != 0) {
    local_8->HoveredIdTimer = (local_8->IO).DeltaTime + local_8->HoveredIdTimer;
  }
  if ((local_8->HoveredId != 0) && (local_8->ActiveId != local_8->HoveredId)) {
    local_8->HoveredIdNotActiveTimer = (local_8->IO).DeltaTime + local_8->HoveredIdNotActiveTimer;
  }
  local_8->HoveredIdPreviousFrame = local_8->HoveredId;
  local_8->HoveredId = 0;
  local_8->HoveredIdAllowOverlap = false;
  if (((local_8->ActiveIdIsAlive != local_8->ActiveId) &&
      (local_8->ActiveIdPreviousFrame == local_8->ActiveId)) && (local_8->ActiveId != 0)) {
    ClearActiveID();
  }
  if (local_8->ActiveId != 0) {
    local_8->ActiveIdTimer = (local_8->IO).DeltaTime + local_8->ActiveIdTimer;
  }
  local_8->LastActiveIdTimer = (local_8->IO).DeltaTime + local_8->LastActiveIdTimer;
  local_8->ActiveIdPreviousFrame = local_8->ActiveId;
  local_8->ActiveIdPreviousFrameWindow = local_8->ActiveIdWindow;
  local_8->ActiveIdPreviousFrameHasBeenEditedBefore =
       (bool)(local_8->ActiveIdHasBeenEditedBefore & 1);
  local_8->ActiveIdIsAlive = 0;
  local_8->ActiveIdHasBeenEditedThisFrame = false;
  local_8->ActiveIdPreviousFrameIsAlive = false;
  local_8->ActiveIdIsJustActivated = false;
  if ((local_8->TempInputId != 0) && (local_8->ActiveId != local_8->TempInputId)) {
    local_8->TempInputId = 0;
  }
  if (local_8->ActiveId == 0) {
    local_8->ActiveIdUsingNavDirMask = 0;
    local_8->ActiveIdUsingNavInputMask = 0;
    local_8->ActiveIdUsingKeyInputMask = 0;
  }
  local_8->DragDropAcceptIdPrev = local_8->DragDropAcceptIdCurr;
  local_8->DragDropAcceptIdCurr = 0;
  local_8->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  local_8->DragDropWithinSource = false;
  local_8->DragDropWithinTarget = false;
  local_8->DragDropHoldJustPressedId = 0;
  IVar4 = GetMergedKeyModFlags();
  (local_8->IO).KeyMods = IVar4;
  memcpy((local_8->IO).KeysDownDurationPrev,(local_8->IO).KeysDownDuration,0x800);
  for (iVar9 = 0; iVar9 < 0x200; iVar9 = iVar9 + 1) {
    if (((local_8->IO).KeysDown[iVar9] & 1U) == 0) {
      in_stack_ffffffffffffffb0 = -1.0;
    }
    else {
      pfVar1 = (local_8->IO).KeysDownDuration + iVar9;
      if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
        in_stack_ffffffffffffffb0 = (local_8->IO).KeysDownDuration[iVar9] + (local_8->IO).DeltaTime;
        in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb0;
      }
      else {
        in_stack_ffffffffffffffb0 = 0.0;
        in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb0;
      }
    }
    (local_8->IO).KeysDownDuration[iVar9] = in_stack_ffffffffffffffb0;
  }
  NavUpdate();
  UpdateMouseInputs();
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar5 = GetTopMostPopupModal();
  if ((pIVar5 != (ImGuiWindow *)0x0) ||
     ((local_8->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < local_8->NavWindowingHighlightAlpha)))) {
    fVar7 = ImMin<float>((local_8->IO).DeltaTime * 6.0 + local_8->DimBgRatio,1.0);
    local_8->DimBgRatio = fVar7;
  }
  else {
    fVar7 = ImMax<float>(-(local_8->IO).DeltaTime * 10.0 + local_8->DimBgRatio,0.0);
    local_8->DimBgRatio = fVar7;
  }
  local_8->MouseCursor = 0;
  local_8->WantTextInputNextFrame = -1;
  local_8->WantCaptureKeyboardNextFrame = -1;
  local_8->WantCaptureMouseNextFrame = -1;
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffdc,1.0,1.0);
  IVar2.y = in_stack_ffffffffffffffe0;
  IVar2.x = in_stack_ffffffffffffffdc;
  local_8->PlatformImePos = IVar2;
  UpdateMouseWheel();
  UpdateTabFocus();
  if ((local_8->WindowsFocusOrder).Size != (local_8->Windows).Size) {
    __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0xf23,"void ImGui::NewFrame()");
  }
  if ((local_8->IO).ConfigWindowsMemoryCompactTimer < 0.0) {
    fVar7 = 3.4028235e+38;
  }
  else {
    fVar7 = (float)local_8->Time - (local_8->IO).ConfigWindowsMemoryCompactTimer;
  }
  new_size = fVar7;
  for (iVar8 = 0;
      restore_focus_to_window_under_popup = (undefined1)((uint)in_stack_ffffffffffffffdc >> 0x18),
      iVar8 != (local_8->Windows).Size; iVar8 = iVar8 + 1) {
    ppIVar6 = ImVector<ImGuiWindow_*>::operator[]
                        ((ImVector<ImGuiWindow_*> *)
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),(int)new_size
                        );
    in_stack_ffffffffffffffc8 = *ppIVar6;
    in_stack_ffffffffffffffc8->WasActive = (bool)(in_stack_ffffffffffffffc8->Active & 1);
    in_stack_ffffffffffffffc8->BeginCount = 0;
    in_stack_ffffffffffffffc8->Active = false;
    in_stack_ffffffffffffffc8->WriteAccessed = false;
    if ((((in_stack_ffffffffffffffc8->WasActive & 1U) == 0) &&
        ((in_stack_ffffffffffffffc8->MemoryCompacted & 1U) == 0)) &&
       (in_stack_ffffffffffffffc8->LastTimeActive < fVar7)) {
      GcCompactTransientWindowBuffers((ImGuiWindow *)0x1b99dd);
    }
  }
  if ((local_8->NavWindow != (ImGuiWindow *)0x0) && ((local_8->NavWindow->WasActive & 1U) == 0)) {
    FocusTopMostWindowUnderOne
              ((ImGuiWindow *)CONCAT44(iVar8,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
  }
  ImVector<ImGuiWindow_*>::resize
            ((ImVector<ImGuiWindow_*> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),(int)new_size);
  ImVector<ImGuiPopupData>::resize
            ((ImVector<ImGuiPopupData> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),(int)new_size);
  ClosePopupsOverWindow
            ((ImGuiWindow *)CONCAT44(iVar9,in_stack_ffffffffffffffe0),
             (bool)restore_focus_to_window_under_popup);
  UpdateDebugToolItemPicker();
  local_8->WithinFrameScopeWithImplicitWindow = true;
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc0,400.0,400.0);
  SetNextWindowSize((ImVec2 *)in_stack_ffffffffffffffc0,(ImGuiCond)max_error);
  Begin(in_stack_00000330,in_stack_00000328,in_stack_00000324);
  if ((local_8->CurrentWindow->IsFallbackWindow & 1U) != 1) {
    __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0xf45,"void ImGui::NewFrame()");
  }
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PreNewFrame(&g);
#endif

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleSegmentMaxError(g.Style.CircleSegmentMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    g.BackgroundDrawList.Clear();
    g.BackgroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.BackgroundDrawList.PushClipRectFullScreen();

    g.ForegroundDrawList.Clear();
    g.ForegroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.ForegroundDrawList.PushClipRectFullScreen();

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    g.DrawData.Clear();

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.IO.ConfigWindowsMemoryCompactTimer >= 0.0f) ? (float)g.Time - g.IO.ConfigWindowsMemoryCompactTimer : FLT_MAX;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PostNewFrame(&g);
#endif
}